

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeUnknownFields
               (UnknownFieldSet *unknown_fields,CodedOutputStream *output)

{
  uint uVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  pointer pUVar3;
  uint32 value;
  UnknownFieldSet *unknown_fields_00;
  uint64 uVar4;
  string *psVar5;
  long lVar6;
  int i;
  long lVar7;
  long lVar8;
  UnknownField *this;
  
  lVar8 = 0;
  lVar7 = 0;
  while( true ) {
    pvVar2 = unknown_fields->fields_;
    if (pvVar2 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)(int)((ulong)((long)(pvVar2->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar2->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (lVar6 <= lVar7) break;
    pUVar3 = (pvVar2->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(uint *)(&pUVar3->field_0x0 + lVar8);
    if (uVar1 >> 0x1d < 5) {
      this = (UnknownField *)(&pUVar3->field_0x0 + lVar8);
      switch(uVar1 >> 0x1d) {
      case 0:
        io::CodedOutputStream::WriteVarint32(output,uVar1 << 3);
        uVar4 = UnknownField::varint(this);
        io::CodedOutputStream::WriteVarint64(output,uVar4);
        break;
      case 1:
        io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 5);
        value = UnknownField::fixed32(this);
        io::CodedOutputStream::WriteLittleEndian32(output,value);
        break;
      case 2:
        io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 1);
        uVar4 = UnknownField::fixed64(this);
        io::CodedOutputStream::WriteLittleEndian64(output,uVar4);
        break;
      case 3:
        io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 2);
        psVar5 = UnknownField::length_delimited_abi_cxx11_(this);
        io::CodedOutputStream::WriteVarint32(output,(uint32)psVar5->_M_string_length);
        psVar5 = UnknownField::length_delimited_abi_cxx11_(this);
        io::CodedOutputStream::WriteString(output,psVar5);
        break;
      case 4:
        io::CodedOutputStream::WriteVarint32(output,uVar1 * 8 + 3);
        unknown_fields_00 = UnknownField::group(this);
        SerializeUnknownFields(unknown_fields_00,output);
        io::CodedOutputStream::WriteVarint32(output,*(int *)this * 8 + 4);
      }
    }
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0x10;
  }
  return;
}

Assistant:

void WireFormat::SerializeUnknownFields(const UnknownFieldSet& unknown_fields,
                                        io::CodedOutputStream* output) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_VARINT));
        output->WriteVarint64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED32));
        output->WriteLittleEndian32(field.fixed32());
        break;
      case UnknownField::TYPE_FIXED64:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_FIXED64));
        output->WriteLittleEndian64(field.fixed64());
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        output->WriteVarint32(field.length_delimited().size());
        output->WriteString(field.length_delimited());
        break;
      case UnknownField::TYPE_GROUP:
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_START_GROUP));
        SerializeUnknownFields(field.group(), output);
        output->WriteVarint32(WireFormatLite::MakeTag(field.number(),
            WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }
}